

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  byte *pbVar1;
  int iVar2;
  bool bVar3;
  uint32_t first_byte_or_zero;
  uint8_t *buffer;
  uint32_t type_id_00;
  uint32_t type_id;
  string message_data;
  uint32_t local_b4;
  uint8_t *local_b0;
  long local_a8;
  uint8_t local_a0 [16];
  CodedInputStream local_90;
  undefined1 local_40 [8];
  Message *local_38;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = '\0';
  type_id_00 = 0;
  local_38 = message;
LAB_003b64ad:
  do {
    pbVar1 = input->buffer_;
    if (pbVar1 < input->buffer_end_) {
      first_byte_or_zero = (uint32_t)*pbVar1;
      if ((char)*pbVar1 < '\0') goto LAB_003b64c7;
      input->buffer_ = pbVar1 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_003b64c7:
      first_byte_or_zero = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
    }
    if (first_byte_or_zero != 0x1a) {
      if (first_byte_or_zero != 0) {
        if (first_byte_or_zero == 0xc) {
          type_id_00 = 1;
          goto LAB_003b6628;
        }
        if (first_byte_or_zero != 0x10) {
          bVar3 = SkipField(input,first_byte_or_zero,(UnknownFieldSet *)0x0);
          goto LAB_003b650f;
        }
        bVar3 = io::CodedInputStream::ReadVarint32(input,&local_b4);
        type_id_00 = local_b4;
        if (bVar3) {
          if (local_a8 == 0) goto LAB_003b64ad;
          local_90.buffer_ = local_b0;
          local_90.total_bytes_read_ = (int)local_a8;
          local_90.buffer_end_ = local_b0 + local_90.total_bytes_read_;
          local_90.input_ = (ZeroCopyInputStream *)0x0;
          local_90.legitimate_message_end_ = false;
          local_90.aliasing_enabled_ = false;
          local_90.overflow_bytes_ = 0;
          local_90.last_tag_ = 0;
          local_90.buffer_size_after_limit_ = 0;
          local_90.total_bytes_limit_ = 0x7fffffff;
          local_90.extension_pool_ = (DescriptorPool *)0x0;
          local_90.extension_factory_ = (MessageFactory *)0x0;
          local_90.recursion_budget_ = input->recursion_budget_;
          local_90.current_limit_ = local_90.total_bytes_read_;
          local_90.recursion_limit_ = local_90.recursion_budget_;
          bVar3 = ParseAndMergeMessageSetItem(google::protobuf::io::CodedInputStream*,google::
                  protobuf::Message*)::MSReflective::ParseField(int,google::protobuf::io::
                  CodedInputStream__(local_40,local_b4,&local_90);
          if (bVar3) {
            local_a8 = 0;
            *local_b0 = '\0';
            io::CodedInputStream::~CodedInputStream(&local_90);
            goto LAB_003b64ad;
          }
          io::CodedInputStream::~CodedInputStream(&local_90);
        }
      }
LAB_003b6626:
      type_id_00 = 0;
      goto LAB_003b6628;
    }
    if (type_id_00 == 0) {
      bVar3 = io::CodedInputStream::ReadVarint32(input,(uint32_t *)&local_90);
      if ((!bVar3) || ((int)(uint)local_90.buffer_ < 0)) goto LAB_003b6626;
      iVar2 = 0x1f;
      if (((uint)local_90.buffer_ | 1) != 0) {
        for (; ((uint)local_90.buffer_ | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      std::__cxx11::string::resize((ulong)&local_b0);
      buffer = io::CodedOutputStream::WriteVarint32ToArray((uint)local_90.buffer_,local_b0);
      bVar3 = io::CodedInputStream::ReadRaw(input,buffer,(uint)local_90.buffer_);
      type_id_00 = 0;
      if (!bVar3) {
LAB_003b6628:
        std::__cxx11::string::~string((string *)&local_b0);
        return SUB41(type_id_00,0);
      }
    }
    else {
      bVar3 = ParseAndMergeMessageSetItem(google::protobuf::io::CodedInputStream*,google::protobuf::
              Message*)::MSReflective::ParseField(int,google::protobuf::io::CodedInputStream__
                        (local_40,type_id_00,input);
LAB_003b650f:
      if (bVar3 == false) goto LAB_003b6626;
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(io::CodedInputStream* input,
                                             Message* message) {
  struct MSReflective {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      const FieldDescriptor* field =
          message_reflection->FindKnownExtensionByNumber(type_id);
      return ParseAndMergeMessageSetField(type_id, field, message, input);
    }

    bool SkipField(uint32_t tag, io::CodedInputStream* input) {
      return WireFormat::SkipField(input, tag, nullptr);
    }

    const Reflection* message_reflection;
    Message* message;
  };

  return ParseMessageSetItemImpl(
      input, MSReflective{message->GetReflection(), message});
}